

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_handler.cpp
# Opt level: O0

void __thiscall
ProtoHandler::OnRemoveBreakPointReq(ProtoHandler *this,RemoveBreakpointParams *params)

{
  bool bVar1;
  EmmyDebuggerManager *this_00;
  reference psVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined1 local_48 [8];
  shared_ptr<BreakPoint> bp;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_> *__range1;
  EmmyDebuggerManager *manager;
  RemoveBreakpointParams *params_local;
  ProtoHandler *this_local;
  
  this_00 = EmmyFacade::GetDebugManager(this->_owner);
  __end1 = std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>::
           begin(&params->breakPoints);
  bp.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>::end
                 (&params->breakPoints);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<BreakPoint>_*,_std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>_>
                                *)&bp.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (!bVar1) break;
    psVar2 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<BreakPoint>_*,_std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<BreakPoint>::shared_ptr((shared_ptr<BreakPoint> *)local_48,psVar2);
    peVar3 = std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_48);
    peVar4 = std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_48);
    EmmyDebuggerManager::RemoveBreakpoint(this_00,&peVar3->file,peVar4->line);
    std::shared_ptr<BreakPoint>::~shared_ptr((shared_ptr<BreakPoint> *)local_48);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<BreakPoint>_*,_std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ProtoHandler::OnRemoveBreakPointReq(RemoveBreakpointParams &params) {
	auto &manager = _owner->GetDebugManager();
	for (auto bp: params.breakPoints) {
		manager.RemoveBreakpoint(bp->file, bp->line);
	}
}